

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void hw_breakpoint_update_all_aarch64(ARMCPU_conflict1 *cpu)

{
  int n;
  
  cpu_breakpoint_remove_all_aarch64(&cpu->parent_obj,0x20);
  (cpu->env).cpu_breakpoint[0xe] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[0xf] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[0xc] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[0xd] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[10] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[0xb] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[8] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[9] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[6] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[7] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[4] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[5] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[2] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[3] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[0] = (CPUBreakpoint *)0x0;
  (cpu->env).cpu_breakpoint[1] = (CPUBreakpoint *)0x0;
  n = 0;
  do {
    hw_breakpoint_update_aarch64(cpu,n);
    n = n + 1;
  } while (n != 0x10);
  return;
}

Assistant:

void hw_breakpoint_update_all(ARMCPU *cpu)
{
    int i;
    CPUARMState *env = &cpu->env;

    /* Completely clear out existing QEMU breakpoints and our array, to
     * avoid possible stale entries following migration load.
     */
    cpu_breakpoint_remove_all(CPU(cpu), BP_CPU);
    memset(env->cpu_breakpoint, 0, sizeof(env->cpu_breakpoint));

    for (i = 0; i < ARRAY_SIZE(cpu->env.cpu_breakpoint); i++) {
        hw_breakpoint_update(cpu, i);
    }
}